

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

string * __thiscall
agr::getCommandOut_abi_cxx11_(string *__return_storage_ptr__,agr *this,char *command)

{
  char *pcVar1;
  runtime_error *this_00;
  unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)> pipe;
  array<char,_128UL> buffer;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.super__Head_base<0UL,__IO_FILE_*,_false>.
  _M_head_impl = (_IO_FILE *)popen((char *)this,"r");
  pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
  super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
  super__Tuple_impl<1UL,_int_(*)(_IO_FILE_*)>.super__Head_base<1UL,_int_(*)(_IO_FILE_*),_false>.
  _M_head_impl = (_Head_base<1UL,_int_(*)(_IO_FILE_*),_false>)pclose;
  if ((FILE *)pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
              super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
              super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl != (FILE *)0x0) {
    while( true ) {
      pcVar1 = fgets(buffer._M_elems,0x80,
                     (FILE *)pipe._M_t.super___uniq_ptr_impl<_IO_FILE,_int_(*)(_IO_FILE_*)>._M_t.
                             super__Tuple_impl<0UL,__IO_FILE_*,_int_(*)(_IO_FILE_*)>.
                             super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl);
      if (pcVar1 == (char *)0x0) break;
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::unique_ptr<_IO_FILE,_int_(*)(_IO_FILE_*)>::~unique_ptr(&pipe);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"popen() failed!");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string getCommandOut( const char* command ) 
   {
    std::array<char, 128> buffer;
    std::string result;
    #ifdef _WIN32
      std::unique_ptr<FILE, decltype( & _pclose )> pipe( _popen( command, "r" ), _pclose );
    #else
      std::unique_ptr<FILE, decltype( & pclose )> pipe( popen( command, "r" ), pclose );
    #endif

    if ( ! pipe ) 
     {
      throw std::runtime_error( "popen() failed!" );
     }

    while ( fgets( buffer.data(), buffer.size(), pipe.get() ) != nullptr ) 
     {
      result += buffer.data();
     }

    return result;
   }